

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kron.hpp
# Opt level: O3

void qclab::dense::kron<qclab::dense::SquareMatrix<std::complex<float>>>
               (SquareMatrix<std::complex<float>_> *A,SquareMatrix<std::complex<float>_> *B,
               SquareMatrix<std::complex<float>_> *kronAB)

{
  _ComplexT _Var1;
  long lVar2;
  long lVar3;
  int64_t j;
  long lVar4;
  long lVar5;
  long lVar6;
  int64_t l;
  long lVar7;
  long lVar8;
  float fVar9;
  _ComplexT _Var10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  
  lVar2 = A->size_;
  lVar3 = B->size_;
  if (kronAB->size_ == lVar3 * lVar2) {
    if (0 < lVar2) {
      lVar5 = 0;
      do {
        if (0 < lVar3) {
          lVar8 = 0;
          do {
            lVar6 = 0;
            lVar4 = 0;
            do {
              lVar7 = 0;
              do {
                _Var10 = (A->data_)._M_t.
                         super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                         .super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl
                         [A->size_ * lVar4 + lVar5]._M_value;
                _Var1 = (B->data_)._M_t.
                        super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                        .super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl
                        [B->size_ * lVar7 + lVar8]._M_value;
                fVar12 = (float)(_Var1 >> 0x20);
                fVar13 = (float)_Var10;
                fVar14 = (float)(_Var10 >> 0x20);
                fVar9 = (float)_Var1 * fVar13 - fVar12 * fVar14;
                fVar11 = fVar13 * fVar12 + fVar14 * (float)_Var1;
                _Var10 = CONCAT44(fVar11,fVar9);
                if ((NAN(fVar9)) && (_Var10 = CONCAT44(fVar11,fVar9), NAN(fVar11))) {
                  _Var10 = __mulsc3(fVar13,fVar14,_Var1,fVar12);
                }
                (kronAB->data_)._M_t.
                super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                .super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl
                [(lVar6 + lVar7) * kronAB->size_ + lVar5 * lVar3 + lVar8]._M_value = _Var10;
                lVar7 = lVar7 + 1;
              } while (lVar3 != lVar7);
              lVar4 = lVar4 + 1;
              lVar6 = lVar6 + lVar3;
            } while (lVar4 != lVar2);
            lVar8 = lVar8 + 1;
          } while (lVar8 != lVar3);
        }
        lVar5 = lVar5 + 1;
      } while (lVar5 != lVar2);
    }
    return;
  }
  __assert_fail("kronAB.rows() == rowsA * rowsB",
                "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O3/_deps/qclabpp-src/include/qclab/dense/kron.hpp"
                ,0x12,
                "void qclab::dense::kron(const T &, const T &, T &) [T = qclab::dense::SquareMatrix<std::complex<float>>]"
               );
}

Assistant:

void kron( const T& A , const T& B , T& kronAB ) {
      const int64_t rowsA = A.rows() ;
      const int64_t colsA = A.cols() ;
      const int64_t rowsB = B.rows() ;
      const int64_t colsB = B.cols() ;
      assert( kronAB.rows() == rowsA * rowsB ) ;
      assert( kronAB.cols() == colsA * colsB ) ;
      #pragma omp parallel for
      for ( int64_t i = 0; i < rowsA; i++ ) {        // i loops over rows of A
        for ( int64_t k = 0; k < rowsB; k++ ) {      // k loops over rows of B
          for ( int64_t j = 0; j < colsA; j++ ) {    // j loops over cols of A
            for ( int64_t l = 0; l < colsB; l++ ) {  // l loops over cols of B
              kronAB( i*rowsB + k , j*colsB + l ) = A(i,j) * B(k,l) ;
            }
          }
        }
      }
    }